

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::GreaterThanEqualTest<unsigned_long,char>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_39;
  int local_38 [4];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_38[3] = 3;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_18,local_38 + 3);
  if (local_18.m_int < 3) {
    local_38[2] = 4;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_20,local_38 + 2);
    if (4 < local_20.m_int) {
      local_38[1] = 6;
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_28,local_38 + 1);
      local_38[0] = 7;
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_39,local_38);
      return (byte)local_39.m_int <= local_28.m_int || local_39.m_int < '\0';
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanEqualTest()
	{
		return
			(U)2 >= SafeInt<T>(3) &&
			SafeInt<T>(4) >= (U)5 &&
			SafeInt<T>(6) >= SafeInt<U>(7);
	}